

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_block_test.cc
# Opt level: O0

void __thiscall leveldb::_Test_EmptyBuilder::_Run(_Test_EmptyBuilder *this)

{
  bool bVar1;
  Slice SVar2;
  Slice local_608;
  Tester local_5f8;
  Slice local_458;
  Tester local_448;
  undefined1 local_2a8 [8];
  FilterBlockReader reader;
  Tester local_260;
  undefined1 local_b0 [8];
  Slice block;
  FilterBlockBuilder builder;
  _Test_EmptyBuilder *this_local;
  
  FilterBlockBuilder::FilterBlockBuilder((FilterBlockBuilder *)&block.size_,(FilterPolicy *)this);
  SVar2 = FilterBlockBuilder::Finish((FilterBlockBuilder *)&block.size_);
  block.data_ = (char *)SVar2.size_;
  local_b0 = (undefined1  [8])SVar2.data_;
  test::Tester::Tester
            (&local_260,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/table/filter_block_test.cc"
             ,0x2f);
  EscapeString_abi_cxx11_((leveldb *)&reader.base_lg_,(Slice *)local_b0);
  test::Tester::IsEq<char[21],std::__cxx11::string>
            (&local_260,(char (*) [21])"\\x00\\x00\\x00\\x00\\x0b",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&reader.base_lg_);
  std::__cxx11::string::~string((string *)&reader.base_lg_);
  test::Tester::~Tester(&local_260);
  FilterBlockReader::FilterBlockReader
            ((FilterBlockReader *)local_2a8,(FilterPolicy *)this,(Slice *)local_b0);
  test::Tester::Tester
            (&local_448,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/table/filter_block_test.cc"
             ,0x31);
  Slice::Slice(&local_458,"foo");
  bVar1 = FilterBlockReader::KeyMayMatch((FilterBlockReader *)local_2a8,0,&local_458);
  test::Tester::Is(&local_448,bVar1,"reader.KeyMayMatch(0, \"foo\")");
  test::Tester::~Tester(&local_448);
  test::Tester::Tester
            (&local_5f8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/table/filter_block_test.cc"
             ,0x32);
  Slice::Slice(&local_608,"foo");
  bVar1 = FilterBlockReader::KeyMayMatch((FilterBlockReader *)local_2a8,100000,&local_608);
  test::Tester::Is(&local_5f8,bVar1,"reader.KeyMayMatch(100000, \"foo\")");
  test::Tester::~Tester(&local_5f8);
  FilterBlockBuilder::~FilterBlockBuilder((FilterBlockBuilder *)&block.size_);
  return;
}

Assistant:

TEST(FilterBlockTest, EmptyBuilder) {
  FilterBlockBuilder builder(&policy_);
  Slice block = builder.Finish();
  ASSERT_EQ("\\x00\\x00\\x00\\x00\\x0b", EscapeString(block));
  FilterBlockReader reader(&policy_, block);
  ASSERT_TRUE(reader.KeyMayMatch(0, "foo"));
  ASSERT_TRUE(reader.KeyMayMatch(100000, "foo"));
}